

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O0

aiVector3D
Assimp::GeometryHelper_Extrusion_GetNextY
          (size_t pSpine_PointIdx,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pSpine,bool pSpine_Closed)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  aiVector3t<float> *paVar4;
  aiVector3t<float> aVar5;
  aiVector3D aVar6;
  aiVector3t<float> local_c0 [2];
  aiVector3t<float> local_a0 [2];
  aiVector3t<float> local_80 [2];
  aiVector3t<float> local_60 [2];
  undefined1 local_44 [8];
  aiVector3D tvec;
  size_t spine_idx_last;
  bool pSpine_Closed_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pSpine_local;
  size_t pSpine_PointIdx_local;
  
  sVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(pSpine);
  tvec._4_8_ = sVar1 - 1;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_44);
  if ((pSpine_PointIdx == 0) || (pSpine_PointIdx == tvec._4_8_)) {
    if (pSpine_Closed) {
      pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (pSpine,1);
      pvVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (pSpine,tvec._4_8_);
      aVar5 = ::operator-(pvVar2,pvVar3);
      local_60[0]._0_8_ = aVar5._0_8_;
      local_60[0].z = aVar5.z;
      local_44._0_4_ = local_60[0].x;
      local_44._4_4_ = local_60[0].y;
      tvec.x = local_60[0].z;
    }
    else if (pSpine_PointIdx == 0) {
      pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (pSpine,1);
      pvVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (pSpine,0);
      aVar5 = ::operator-(pvVar2,pvVar3);
      local_80[0]._0_8_ = aVar5._0_8_;
      local_80[0].z = aVar5.z;
      local_44._0_4_ = local_80[0].x;
      local_44._4_4_ = local_80[0].y;
      tvec.x = local_80[0].z;
    }
    else {
      pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (pSpine,tvec._4_8_);
      pvVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (pSpine,tvec._4_8_ - 1);
      aVar5 = ::operator-(pvVar2,pvVar3);
      local_a0[0]._0_8_ = aVar5._0_8_;
      local_a0[0].z = aVar5.z;
      local_44._0_4_ = local_a0[0].x;
      local_44._4_4_ = local_a0[0].y;
      tvec.x = local_a0[0].z;
    }
  }
  else {
    pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       (pSpine,pSpine_PointIdx + 1);
    pvVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       (pSpine,pSpine_PointIdx - 1);
    aVar5 = ::operator-(pvVar2,pvVar3);
    local_c0[0]._0_8_ = aVar5._0_8_;
    local_c0[0].z = aVar5.z;
    local_44._0_4_ = local_c0[0].x;
    local_44._4_4_ = local_c0[0].y;
    tvec.x = local_c0[0].z;
  }
  paVar4 = aiVector3t<float>::Normalize((aiVector3t<float> *)local_44);
  aVar6.x = paVar4->x;
  aVar6.y = paVar4->y;
  aVar6.z = paVar4->z;
  return aVar6;
}

Assistant:

static aiVector3D GeometryHelper_Extrusion_GetNextY(const size_t pSpine_PointIdx, const std::vector<aiVector3D>& pSpine, const bool pSpine_Closed)
{
    const size_t spine_idx_last = pSpine.size() - 1;
    aiVector3D tvec;

	if((pSpine_PointIdx == 0) || (pSpine_PointIdx == spine_idx_last))// at first special cases
	{
		if(pSpine_Closed)
		{// If the spine curve is closed: The SCP for the first and last points is the same and is found using (spine[1] - spine[n - 2]) to compute the Y-axis.
			// As we even for closed spine curve last and first point in pSpine are not the same: duplicates(spine[n - 1] which are equivalent to spine[0])
			// in tail are removed.
			// So, last point in pSpine is a spine[n - 2]
			tvec = pSpine[1] - pSpine[spine_idx_last];
		}
		else if(pSpine_PointIdx == 0)
		{// The Y-axis used for the first point is the vector from spine[0] to spine[1]
			tvec = pSpine[1] - pSpine[0];
		}
		else
		{// The Y-axis used for the last point it is the vector from spine[n-2] to spine[n-1]. In our case(see above about dropping tail) spine[n - 1] is
			// the spine[0].
			tvec = pSpine[spine_idx_last] - pSpine[spine_idx_last - 1];
		}
	}// if((pSpine_PointIdx == 0) || (pSpine_PointIdx == spine_idx_last))
	else
	{// For all points other than the first or last: The Y-axis for spine[i] is found by normalizing the vector defined by (spine[i+1] - spine[i-1]).
		tvec = pSpine[pSpine_PointIdx + 1] - pSpine[pSpine_PointIdx - 1];
	}// if((pSpine_PointIdx == 0) || (pSpine_PointIdx == spine_idx_last)) else

	return tvec.Normalize();
}